

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.cpp
# Opt level: O2

Float pbrt::Turbulence(Point3f *p,Vector3f *dpdx,Vector3f *dpdy,Float omega,int maxOctaves)

{
  undefined8 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int i;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 extraout_var [60];
  undefined1 auVar15 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float fVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 in_register_00001344 [12];
  Point3<float> PVar19;
  Tuple3<pbrt::Point3,_float> local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  fVar16 = (dpdx->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar10 = (dpdy->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar8 = ZEXT416((uint)(dpdx->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar16)),auVar8,auVar8);
  auVar8 = ZEXT416((uint)(dpdy->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10)),auVar8,auVar8);
  auVar9 = ZEXT416((uint)(dpdy->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar8 = vfmadd213ss_fma(auVar9,auVar9,auVar8);
  auVar9 = ZEXT416((uint)(dpdx->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar3 = vfmadd213ss_fma(auVar9,auVar9,auVar3);
  auVar8 = vmaxss_avx(auVar8,auVar3);
  auVar17._0_4_ = Log2(auVar8._0_4_);
  auVar17._4_60_ = extraout_var;
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf000000),0),auVar17._0_16_,ZEXT416(0xbf800000));
  auVar8._0_4_ = (float)maxOctaves;
  auVar8._4_12_ = in_register_00001344;
  auVar8 = vminss_avx(auVar8,auVar3);
  uVar1 = vcmpss_avx512f(auVar3,ZEXT816(0) << 0x40,1);
  auVar17 = ZEXT464(0x3f800000);
  local_48 = ZEXT816(0);
  local_38._4_12_ = auVar8._4_12_;
  local_38._0_4_ = (uint)!(bool)((byte)uVar1 & 1) * auVar8._0_4_;
  auVar8 = vroundss_avx(local_38,local_38,9);
  uVar5 = (uint)auVar8._0_4_;
  auVar18 = ZEXT1664(auVar17._0_16_);
  uVar6 = ~((int)uVar5 >> 0x1f) & uVar5;
  while( true ) {
    bVar7 = uVar6 == 0;
    uVar6 = uVar6 - 1;
    fVar16 = auVar17._0_4_;
    fVar10 = auVar18._0_4_;
    if (bVar7) break;
    auVar15 = ZEXT856(auVar18._8_8_);
    PVar19 = Tuple3<pbrt::Point3,float>::operator*((Tuple3<pbrt::Point3,float> *)p,fVar10);
    local_58.z = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
    auVar12._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar15;
    local_58._0_8_ = vmovlps_avx(auVar12._0_16_);
    auVar13._0_4_ = Noise((Point3f *)&local_58);
    auVar13._4_60_ = extraout_var_00;
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar8 = vandps_avx512vl(auVar13._0_16_,auVar4);
    auVar18 = ZEXT464((uint)(fVar10 * 1.99));
    local_48 = vfmadd231ss_fma(local_48,ZEXT416((uint)fVar16),auVar8);
    auVar17 = ZEXT464((uint)(fVar16 * omega));
  }
  auVar11._0_4_ = (((float)local_38._0_4_ - (float)(int)uVar5) + -0.3) / 0.39999998;
  auVar11._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
  uVar1 = vcmpss_avx512f(auVar11,ZEXT816(0) << 0x40,1);
  fVar2 = (float)((uint)!(bool)((byte)uVar1 & 1) * auVar8._0_4_);
  auVar9._4_12_ = auVar8._4_12_;
  auVar9._0_4_ = fVar2;
  auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar9,ZEXT416(0x40400000));
  fVar2 = fVar2 * fVar2 * auVar8._0_4_;
  auVar15 = ZEXT856(auVar18._8_8_);
  PVar19 = Tuple3<pbrt::Point3,float>::operator*((Tuple3<pbrt::Point3,float> *)p,fVar10);
  local_58.z = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
  auVar18._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar18._8_56_ = auVar15;
  local_58._0_8_ = vmovlps_avx(auVar18._0_16_);
  auVar14._0_4_ = Noise((Point3f *)&local_58);
  auVar14._4_60_ = extraout_var_01;
  auVar3._8_4_ = 0x7fffffff;
  auVar3._0_8_ = 0x7fffffff7fffffff;
  auVar3._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx512vl(auVar14._0_16_,auVar3);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * auVar8._0_4_)),ZEXT416((uint)(1.0 - fVar2)),
                           ZEXT416(0x3e4ccccd));
  auVar8 = vfmadd213ss_fma(auVar8,ZEXT416((uint)fVar16),ZEXT416((uint)local_48._0_4_));
  for (; (int)uVar5 < maxOctaves; uVar5 = uVar5 + 1) {
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar16),SUB6416(ZEXT464(0x3e4ccccd),0));
    fVar16 = fVar16 * omega;
  }
  return auVar8._0_4_;
}

Assistant:

Float Turbulence(const Point3f &p, const Vector3f &dpdx, const Vector3f &dpdy,
                 Float omega, int maxOctaves) {
    // Compute number of octaves for antialiased FBm
    Float len2 = std::max(LengthSquared(dpdx), LengthSquared(dpdy));
    Float n = Clamp(-1 - .5f * Log2(len2), 0, maxOctaves);
    int nInt = std::floor(n);

    // Compute sum of octaves of noise for turbulence
    Float sum = 0, lambda = 1, o = 1;
    for (int i = 0; i < nInt; ++i) {
        sum += o * std::abs(Noise(lambda * p));
        lambda *= 1.99f;
        o *= omega;
    }

    // Account for contributions of clamped octaves in turbulence
    Float nPartial = n - nInt;
    sum += o * Lerp(SmoothStep(nPartial, .3f, .7f), 0.2, std::abs(Noise(lambda * p)));
    for (int i = nInt; i < maxOctaves; ++i) {
        sum += o * 0.2f;
        o *= omega;
    }

    return sum;
}